

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

void __thiscall
icu_63::UVector::sortedInsert(UVector *this,UElement e,UElementComparator *compare,UErrorCode *ec)

{
  int8_t iVar1;
  UBool UVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = this->count;
  if (iVar4 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    do {
      iVar5 = (iVar6 + iVar4) / 2;
      iVar1 = (*compare)((UElement)this->elements[iVar5].pointer,(UElement)e.pointer);
      if (iVar1 < '\x01') {
        iVar6 = iVar5 + 1;
        iVar5 = iVar4;
      }
      iVar4 = iVar5;
    } while (iVar6 != iVar4);
  }
  UVar2 = ensureCapacity(this,this->count + 1,ec);
  if (UVar2 != '\0') {
    lVar3 = (long)this->count;
    if (iVar6 < this->count) {
      do {
        this->elements[lVar3] = this->elements[lVar3 + -1];
        lVar3 = lVar3 + -1;
      } while (iVar6 < lVar3);
    }
    this->elements[iVar6] = e;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector::sortedInsert(UElement e, UElementComparator *compare, UErrorCode& ec) {
    // Perform a binary search for the location to insert tok at.  Tok
    // will be inserted between two elements a and b such that a <=
    // tok && tok < b, where there is a 'virtual' elements[-1] always
    // less than tok and a 'virtual' elements[count] always greater
    // than tok.
    int32_t min = 0, max = count;
    while (min != max) {
        int32_t probe = (min + max) / 2;
        int8_t c = (*compare)(elements[probe], e);
        if (c > 0) {
            max = probe;
        } else {
            // assert(c <= 0);
            min = probe + 1;
        }
    }
    if (ensureCapacity(count + 1, ec)) {
        for (int32_t i=count; i>min; --i) {
            elements[i] = elements[i-1];
        }
        elements[min] = e;
        ++count;
    }
}